

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

void __thiscall tf::Executor::_tear_down_topology(Executor *this,Worker *worker,Topology *tpg)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  __shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2> *this_00;
  _List_iterator<tf::Taskflow> *__x;
  long *in_RDX;
  scoped_lock<std::mutex> satellite_lock;
  optional<std::_List_iterator<tf::Taskflow>_> satellite;
  type fetched_tpg;
  unique_lock<std::mutex> lock_1;
  lock_guard<std::mutex> lock;
  Taskflow *f;
  mutex_type *in_stack_ffffffffffffff58;
  Executor *in_stack_ffffffffffffff60;
  const_iterator in_stack_ffffffffffffff68;
  _List_const_iterator<tf::Taskflow> local_78 [2];
  undefined8 local_68;
  promise<void> *in_stack_ffffffffffffffa0;
  Topology *in_stack_ffffffffffffffb0;
  Topology *in_stack_ffffffffffffffc0;
  Worker *in_stack_ffffffffffffffc8;
  Executor *in_stack_ffffffffffffffd0;
  
  lVar1 = *in_RDX;
  bVar2 = std::__exception_ptr::exception_ptr::operator_cast_to_bool
                    ((exception_ptr *)(in_RDX + 0xe));
  if (((bVar2) ||
      (bVar2 = Topology::cancelled((Topology *)in_stack_ffffffffffffff68._M_node), bVar2)) ||
     (bVar2 = std::function<bool_()>::operator()((function<bool_()> *)in_stack_ffffffffffffff60),
     bVar2)) {
    bVar2 = std::operator!=((function<void_()> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58
                           );
    if (bVar2) {
      std::function<void_()>::operator()((function<void_()> *)in_stack_ffffffffffffff60);
    }
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    sVar3 = std::
            queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
            ::size((queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
                    *)0x11e728);
    if (sVar3 < 2) {
      in_stack_ffffffffffffff60 =
           (Executor *)
           std::
           queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
           ::front((queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
                    *)0x11e7df);
      std::shared_ptr<tf::Topology>::shared_ptr
                ((shared_ptr<tf::Topology> *)in_stack_ffffffffffffff60,
                 (shared_ptr<tf::Topology> *)in_stack_ffffffffffffff58);
      std::
      queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
      ::pop((queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
             *)0x11e806);
      local_68 = *(undefined8 *)(lVar1 + 0xb8);
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)in_stack_ffffffffffffff60);
      std::__shared_ptr_access<tf::Topology,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<tf::Topology,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x11e832);
      Topology::_carry_out_promise(in_stack_ffffffffffffffb0);
      _decrement_topology(in_stack_ffffffffffffff60);
      bVar2 = std::optional::operator_cast_to_bool
                        ((optional<std::_List_iterator<tf::Taskflow>_> *)0x11e852);
      if (bVar2) {
        std::scoped_lock<std::mutex>::scoped_lock
                  ((scoped_lock<std::mutex> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        __x = std::optional<std::_List_iterator<tf::Taskflow>_>::operator*
                        ((optional<std::_List_iterator<tf::Taskflow>_> *)0x11e882);
        std::_List_const_iterator<tf::Taskflow>::_List_const_iterator(local_78,__x);
        std::__cxx11::list<tf::Taskflow,_std::allocator<tf::Taskflow>_>::erase
                  ((list<tf::Taskflow,_std::allocator<tf::Taskflow>_> *)in_stack_ffffffffffffff60,
                   in_stack_ffffffffffffff68);
        std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x11e8ac);
      }
      std::shared_ptr<tf::Topology>::~shared_ptr((shared_ptr<tf::Topology> *)0x11e8d2);
    }
    else {
      std::promise<void>::set_value(in_stack_ffffffffffffffa0);
      std::
      queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
      ::pop((queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
             *)0x11e762);
      this_00 = &std::
                 queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
                 ::front((queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
                          *)0x11e775)->super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
      _decrement_topology(in_stack_ffffffffffffff60);
      _set_up_topology(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0
                      );
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_stack_ffffffffffffff60)
    ;
  }
  else {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    _set_up_topology(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x11e6b0);
  }
  return;
}

Assistant:

inline void Executor::_tear_down_topology(Worker& worker, Topology* tpg) {

  auto &f = tpg->_taskflow;

  //assert(&tpg == &(f._topologies.front()));

  // case 1: we still need to run the topology again
  if(!tpg->_exception_ptr && !tpg->cancelled() && !tpg->_pred()) {
    //assert(tpg->_join_counter == 0);
    std::lock_guard<std::mutex> lock(f._mutex);
    _set_up_topology(&worker, tpg);
  }
  // case 2: the final run of this topology
  else {

    // invoke the callback after each run
    if(tpg->_call != nullptr) {
      tpg->_call();
    }

    // If there is another run (interleave between lock)
    if(std::unique_lock<std::mutex> lock(f._mutex); f._topologies.size()>1) {
      //assert(tpg->_join_counter == 0);

      // Set the promise
      tpg->_promise.set_value();
      f._topologies.pop();
      tpg = f._topologies.front().get();

      // decrement the topology
      _decrement_topology();

      // set up topology needs to be under the lock or it can
      // introduce memory order error with pop
      _set_up_topology(&worker, tpg);
    }
    else {
      //assert(f._topologies.size() == 1);

      auto fetched_tpg {std::move(f._topologies.front())};
      f._topologies.pop();
      auto satellite {f._satellite};

      lock.unlock();
      
      // Soon after we carry out the promise, there is no longer any guarantee
      // for the lifetime of the associated taskflow.
      fetched_tpg->_carry_out_promise();

      _decrement_topology();

      // remove the taskflow if it is managed by the executor
      // TODO: in the future, we may need to synchronize on wait
      // (which means the following code should the moved before set_value)
      if(satellite) {
        std::scoped_lock<std::mutex> satellite_lock(_taskflows_mutex);
        _taskflows.erase(*satellite);
      }
    }
  }
}